

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

bool __thiscall
SGParser::Generator::RegExprDFAParseHandler::Reduce
          (RegExprDFAParseHandler *this,Parse<SGParser::Generator::RegExprDFAParseElement> *parse,
          uint productionID)

{
  uint uVar1;
  RegExprDataType RVar2;
  Lex *pLVar3;
  anon_union_8_3_5244310a_for_RegExprDFAParseElement_3 aVar4;
  const_iterator *this_00;
  undefined4 uVar5;
  ulong uVar6;
  pointer puVar7;
  bool bVar8;
  size_type sVar9;
  reference pvVar10;
  RegExprDFANode *pRVar11;
  size_type sVar12;
  undefined8 uVar13;
  pointer ppVar14;
  undefined8 uVar15;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar16;
  RegExprDFAParseElement *pRVar17;
  uint local_238;
  uint local_234;
  uint code_3;
  uint code2_1;
  uint code_2;
  uint code2;
  uint code_1;
  uint code;
  RegExprDFANode **local_218;
  __normal_iterator<SGParser::Generator::RegExprDFANode_**,_std::vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>_>
  local_210;
  __normal_iterator<SGParser::Generator::RegExprDFANode_**,_std::vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>_>
  local_208;
  const_iterator local_200;
  DFASyntaxTree<SGParser::Generator::RegExprDFANode> *local_1f8;
  DFASyntaxTree<SGParser::Generator::RegExprDFANode> *macroTree;
  _Self local_1e8;
  int local_1dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  type *local_198;
  type *_;
  type *name;
  _Self local_180;
  const_iterator __end5;
  const_iterator __begin5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
  *__range5;
  string names;
  _Self local_140;
  _Self *local_138;
  const_iterator *iter;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
  *map;
  uint *ord;
  iterator __end4;
  iterator __begin4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  String macroName;
  ulong uStack_e0;
  uint j_1;
  size_t i_1;
  undefined1 local_d0 [3];
  bool f;
  uint k_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> charList_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pgroupSet_1;
  ulong uStack_a8;
  uint j;
  size_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> charList_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pgroupSet;
  undefined1 local_78 [4];
  uint k;
  vector<unsigned_int,_std::allocator<unsigned_int>_> charList;
  RegExprDFANode *pnewNode_4;
  RegExprDFANode *pnewNode_3;
  RegExprDFANode *pnewNode_2;
  RegExprDFANode *pnewNode_1;
  RegExprDFANode *pnewNode;
  uint productionID_local;
  Parse<SGParser::Generator::RegExprDFAParseElement> *parse_local;
  RegExprDFAParseHandler *this_local;
  
  if (productionID - 1 < 0x13 || productionID == 0x14) {
    switch((long)&switchD_0019b29d::switchdataD_001ab9f8 +
           (long)(int)(&switchD_0019b29d::switchdataD_001ab9f8)[productionID - 1]) {
    case 0x19b29f:
      pRVar11 = (RegExprDFANode *)operator_new(0x80);
      RegExprDFANode::RegExprDFANode(pRVar11,And);
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      RegExprDFANode::Add(pRVar11,(pRVar17->field_1).pNode);
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
      RegExprDFANode::Add(pRVar11,(pRVar17->field_1).pNode);
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      (pRVar17->field_1).pNode = pRVar11;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      pRVar17->DataType = Node;
      break;
    case 0x19b37c:
      break;
    case 0x19b381:
      pRVar11 = (RegExprDFANode *)operator_new(0x80);
      RegExprDFANode::RegExprDFANode(pRVar11,Or);
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      RegExprDFANode::Add(pRVar11,(pRVar17->field_1).pNode);
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,2);
      RegExprDFANode::Add(pRVar11,(pRVar17->field_1).pNode);
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      (pRVar17->field_1).pNode = pRVar11;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      pRVar17->DataType = Node;
      break;
    case 0x19b45e:
      break;
    case 0x19b463:
      pRVar11 = (RegExprDFANode *)operator_new(0x80);
      RegExprDFANode::RegExprDFANode(pRVar11,Star);
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      RegExprDFANode::Add(pRVar11,(pRVar17->field_1).pNode);
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      (pRVar17->field_1).pNode = pRVar11;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      pRVar17->DataType = Node;
      break;
    case 0x19b517:
      pRVar11 = (RegExprDFANode *)operator_new(0x80);
      RegExprDFANode::RegExprDFANode(pRVar11,Plus);
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      RegExprDFANode::Add(pRVar11,(pRVar17->field_1).pNode);
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      (pRVar17->field_1).pNode = pRVar11;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      pRVar17->DataType = Node;
      break;
    case 0x19b5cb:
      pRVar11 = (RegExprDFANode *)operator_new(0x80);
      RegExprDFANode::RegExprDFANode(pRVar11,Question);
      charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pRVar11;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      RegExprDFANode::Add(pRVar11,(pRVar17->field_1).pNode);
      puVar7 = charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      (pRVar17->field_1).pChars = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)puVar7;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      pRVar17->DataType = Node;
      break;
    case 0x19b67f:
      break;
    case 0x19b684:
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
      aVar4 = pRVar17->field_1;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      pRVar17->field_1 = aVar4;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
      RVar2 = pRVar17->DataType;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      pRVar17->DataType = RVar2;
      break;
    case 0x19b6e7:
      pRVar11 = (RegExprDFANode *)operator_new(0x80);
      uVar1 = this->PositionCount;
      this->PositionCount = uVar1 + 1;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      RegExprDFANode::RegExprDFANode(pRVar11,Char,uVar1,(pRVar17->field_1).ch);
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      (pRVar17->field_1).pNode = pRVar11;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      pRVar17->DataType = Node;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      std::
      vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
      ::push_back(&this->Nodes,(value_type *)&(pRVar17->field_1).pChars);
      break;
    case 0x19b7d1:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,0xfd);
      for (pgroupSet._4_4_ = 1; pgroupSet._4_4_ < 0x100; pgroupSet._4_4_ = pgroupSet._4_4_ + 1) {
        if ((pgroupSet._4_4_ != 10) && (pgroupSet._4_4_ != 0xd)) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,
                     (value_type_conflict2 *)((long)&pgroupSet + 4));
        }
      }
      pRVar11 = (RegExprDFANode *)operator_new(0x80);
      uVar1 = this->PositionCount;
      this->PositionCount = uVar1 + 1;
      RegExprDFANode::RegExprDFANode
                (pRVar11,Char,uVar1,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78)
      ;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      (pRVar17->field_1).pNode = pRVar11;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      pRVar17->DataType = Node;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      std::
      vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
      ::push_back(&this->Nodes,(value_type *)&(pRVar17->field_1).pChars);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
      break;
    case 0x19b940:
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
      charList_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(pRVar17->field_1).pChars;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
      for (uStack_a8 = 0; uVar6 = uStack_a8,
          sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             charList_1.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage), uVar6 < sVar9;
          uStack_a8 = uStack_a8 + 2) {
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             charList_1.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,uStack_a8);
        for (pgroupSet_1._4_4_ = *pvVar10; uVar1 = pgroupSet_1._4_4_,
            pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 charList_1.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,uStack_a8 + 1),
            uVar1 <= *pvVar10; pgroupSet_1._4_4_ = pgroupSet_1._4_4_ + 1) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,
                     (value_type_conflict2 *)((long)&pgroupSet_1 + 4));
        }
      }
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
      RegExprDFAParseElement::Destroy(pRVar17);
      pRVar11 = (RegExprDFANode *)operator_new(0x80);
      uVar1 = this->PositionCount;
      this->PositionCount = uVar1 + 1;
      RegExprDFANode::RegExprDFANode
                (pRVar11,Char,uVar1,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      (pRVar17->field_1).pNode = pRVar11;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      pRVar17->DataType = Node;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      std::
      vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
      ::push_back(&this->Nodes,(value_type *)&(pRVar17->field_1).pChars);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
      break;
    case 0x19bb5d:
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,2);
      charList_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(pRVar17->field_1).pChars;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d0);
      for (i_1._4_4_ = 1; i_1._4_4_ < 0x100; i_1._4_4_ = i_1._4_4_ + 1) {
        i_1._3_1_ = 0;
        for (uStack_e0 = 0;
            sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               charList_2.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage), uStack_e0 < sVar9
            ; uStack_e0 = uStack_e0 + 2) {
          pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               charList_2.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,uStack_e0);
          for (macroName.field_2._12_4_ = *pvVar10; uVar5 = macroName.field_2._12_4_,
              pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   charList_2.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,uStack_e0 + 1),
              (uint)uVar5 <= *pvVar10; macroName.field_2._12_4_ = macroName.field_2._12_4_ + 1) {
            if (macroName.field_2._12_4_ == i_1._4_4_) {
              i_1._3_1_ = 1;
            }
          }
        }
        if ((i_1._3_1_ & 1) == 0) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d0,
                     (value_type_conflict2 *)((long)&i_1 + 4));
        }
      }
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,2);
      RegExprDFAParseElement::Destroy(pRVar17);
      pRVar11 = (RegExprDFANode *)operator_new(0x80);
      uVar1 = this->PositionCount;
      this->PositionCount = uVar1 + 1;
      RegExprDFANode::RegExprDFANode
                (pRVar11,Char,uVar1,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d0)
      ;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      (pRVar17->field_1).pNode = pRVar11;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      pRVar17->DataType = Node;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      std::
      vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
      ::push_back(&this->Nodes,(value_type *)&(pRVar17->field_1).pChars);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d0);
      break;
    case 0x19bddd:
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
      if ((pRVar17->field_1).pChars == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        __assert_fail("parse[1].pChars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                      ,0x2f1,
                      "virtual bool SGParser::Generator::RegExprDFAParseHandler::Reduce(Parse<RegExprDFAParseElement> &, unsigned int)"
                     );
      }
      std::__cxx11::string::string((string *)&__range4);
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size((pRVar17->field_1).pChars);
      std::__cxx11::string::reserve((ulong)&__range4);
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
      pvVar16 = (pRVar17->field_1).pChars;
      __end4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar16);
      ord = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar16);
      while (bVar8 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                         *)&ord), bVar8) {
        map = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
               *)__gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end4);
        std::__cxx11::string::push_back((char)&__range4);
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end4);
      }
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
      RegExprDFAParseElement::Destroy(pRVar17);
      if (this->pMacroSyntaxTrees ==
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
           *)0x0) {
        __assert_fail("pMacroSyntaxTrees != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                      ,0x2fc,
                      "virtual bool SGParser::Generator::RegExprDFAParseHandler::Reduce(Parse<RegExprDFAParseElement> &, unsigned int)"
                     );
      }
      iter = (const_iterator *)this->pMacroSyntaxTrees;
      local_140._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
                   *)iter,(key_type *)&__range4);
      local_138 = &local_140;
      names.field_2._8_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
                  *)iter);
      bVar8 = std::operator==(&local_140,(_Self *)((long)&names.field_2 + 8));
      if (bVar8) {
        std::__cxx11::string::string((string *)&__range5);
        this_00 = iter;
        __end5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
                 ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
                          *)iter);
        local_180._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
                    *)this_00);
        while (bVar8 = std::operator!=(&__end5,&local_180), bVar8) {
          name = &std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>
                  ::operator*(&__end5)->first;
          _ = (type *)std::
                      get<0ul,std::__cxx11::string_const,SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>*>
                                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>
                                  *)name);
          local_198 = std::
                      get<1ul,std::__cxx11::string_const,SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>*>
                                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>
                                  *)name);
          std::operator+(&local_1d8," \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_);
          std::operator+(&local_1b8,&local_1d8,'\'');
          std::__cxx11::string::operator+=((string *)&__range5,(string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>
          ::operator++(&__end5);
        }
        pLVar3 = this->pLex;
        uVar15 = std::__cxx11::string::data();
        sVar12 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
                 ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
                         *)iter);
        uVar13 = std::__cxx11::string::data();
        Lex::CheckForErrorAndReport
                  (pLVar3,"Macro \'%s\' not defined; there are %zu known macros:%s",uVar15,sVar12,
                   uVar13);
        this_local._7_1_ = 0;
        local_1dc = 1;
        std::__cxx11::string::~string((string *)&__range5);
      }
      else {
        if (this->pLex == (Lex *)0x0) {
          __assert_fail("pLex != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                        ,0x30a,
                        "virtual bool SGParser::Generator::RegExprDFAParseHandler::Reduce(Parse<RegExprDFAParseElement> &, unsigned int)"
                       );
        }
        local_1e8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&this->pLex->Macros,(key_type *)&__range4);
        macroTree = (DFASyntaxTree<SGParser::Generator::RegExprDFANode> *)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::end(&this->pLex->Macros);
        bVar8 = std::operator!=(&local_1e8,(_Self *)&macroTree);
        if (!bVar8) {
          __assert_fail("pLex->Macros.find(macroName) != pLex->Macros.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                        ,0x30b,
                        "virtual bool SGParser::Generator::RegExprDFAParseHandler::Reduce(Parse<RegExprDFAParseElement> &, unsigned int)"
                       );
        }
        ppVar14 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>
                  ::operator->(local_138);
        if (ppVar14->second == (DFASyntaxTree<SGParser::Generator::RegExprDFANode> *)0x0) {
          __assert_fail("iter->second",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                        ,0x30e,
                        "virtual bool SGParser::Generator::RegExprDFAParseHandler::Reduce(Parse<RegExprDFAParseElement> &, unsigned int)"
                       );
        }
        ppVar14 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>
                  ::operator->(local_138);
        local_1f8 = ppVar14->second;
        if (local_1f8->pRoot == (RegExprDFANode *)0x0) {
          pLVar3 = this->pLex;
          uVar15 = std::__cxx11::string::data();
          Lex::CheckForErrorAndReport
                    (pLVar3,"Invalid regular expression in macro \'%s\' used",uVar15);
          this_local._7_1_ = 0;
          local_1dc = 1;
        }
        else {
          aVar4 = (anon_union_8_3_5244310a_for_RegExprDFAParseElement_3)local_1f8->pRoot;
          pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
          pRVar17->field_1 = aVar4;
          pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
          pRVar17->DataType = Node;
          local_208._M_current =
               (RegExprDFANode **)
               std::
               vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
               ::end(&this->Nodes);
          __gnu_cxx::
          __normal_iterator<SGParser::Generator::RegExprDFANode*const*,std::vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>>
          ::__normal_iterator<SGParser::Generator::RegExprDFANode**>
                    ((__normal_iterator<SGParser::Generator::RegExprDFANode*const*,std::vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>>
                      *)&local_200,&local_208);
          local_210._M_current =
               (RegExprDFANode **)
               std::
               vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
               ::begin(&local_1f8->CharNodes);
          local_218 = (RegExprDFANode **)
                      std::
                      vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                      ::end(&local_1f8->CharNodes);
          _code_1 = std::
                    vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
                    ::
                    insert<__gnu_cxx::__normal_iterator<SGParser::Generator::RegExprDFANode**,std::vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>>,void>
                              ((vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
                                *)&this->Nodes,local_200,local_210,
                               (__normal_iterator<SGParser::Generator::RegExprDFANode_**,_std::vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>_>
                                )local_218);
          local_1f8->pRoot = (RegExprDFANode *)0x0;
          local_1dc = 2;
        }
      }
      std::__cxx11::string::~string((string *)&__range4);
      if (local_1dc == 1) goto LAB_0019c7e6;
      break;
    case 0x19c466:
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      code2 = (pRVar17->field_1).ch;
      pvVar16 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(pvVar16);
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      (pRVar17->field_1).pChars = pvVar16;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      pRVar17->DataType = Chars;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((pRVar17->field_1).pChars,&code2);
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((pRVar17->field_1).pChars,&code2);
      break;
    case 0x19c500:
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
      pvVar16 = (pRVar17->field_1).pChars;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (pvVar16,&(pRVar17->field_1).ch);
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
      aVar4 = pRVar17->field_1;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      pRVar17->field_1 = aVar4;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
      RVar2 = pRVar17->DataType;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      pRVar17->DataType = RVar2;
      break;
    case 0x19c59c:
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      code_2 = (pRVar17->field_1).ch;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,2);
      code2_1 = (pRVar17->field_1).ch;
      pvVar16 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(pvVar16);
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      (pRVar17->field_1).pChars = pvVar16;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      pRVar17->DataType = Chars;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((pRVar17->field_1).pChars,&code_2);
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((pRVar17->field_1).pChars,&code2_1);
      break;
    case 0x19c64d:
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      code_3 = (pRVar17->field_1).ch;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,2);
      local_234 = (pRVar17->field_1).ch;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,3);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((pRVar17->field_1).pChars,&code_3);
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,3);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((pRVar17->field_1).pChars,&local_234);
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,3);
      aVar4 = pRVar17->field_1;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      pRVar17->field_1 = aVar4;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,3);
      RVar2 = pRVar17->DataType;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      pRVar17->DataType = RVar2;
      break;
    case 0x19c719:
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      local_238 = (pRVar17->field_1).ch;
      pvVar16 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(pvVar16);
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      (pRVar17->field_1).pChars = pvVar16;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      pRVar17->DataType = Chars;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((pRVar17->field_1).pChars,&local_238);
      break;
    case 0x19c793:
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
      pvVar16 = (pRVar17->field_1).pChars;
      pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (pvVar16,&(pRVar17->field_1).ch);
    }
  }
  else {
    pRVar17 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar17->DataType = Null;
  }
  this_local._7_1_ = 1;
LAB_0019c7e6:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Reduce(Parse<RegExprDFAParseElement>& parse, unsigned productionID) override {
        switch (productionID) {
            // RegExp --> RegExp  A
            case RE_RegExpConcat: {
                const auto pnewNode = new RegExprDFANode{RegExprDFANode::NodeType::And};
                pnewNode->Add(parse[0].pNode);
                pnewNode->Add(parse[1].pNode);

                parse[0].pNode    = pnewNode;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;
                break;
            }

                // RegExp --> A
            case RE_RegExp:
                break;

                // A --> A '|' B
            case RE_AOr: {
                const auto pnewNode = new RegExprDFANode{RegExprDFANode::NodeType::Or};
                pnewNode->Add(parse[0].pNode);
                pnewNode->Add(parse[2].pNode);

                parse[0].pNode    = pnewNode;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;
                break;
            }
                // A --> B
            case RE_A:
                break;

                // B --> B '*'
            case RE_BStar: {
                const auto pnewNode = new RegExprDFANode{RegExprDFANode::NodeType::Star};
                pnewNode->Add(parse[0].pNode);

                parse[0].pNode    = pnewNode;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;
                break;
            }
                // B --> B '+'
            case RE_BPlus: {
                const auto pnewNode = new RegExprDFANode{RegExprDFANode::NodeType::Plus};
                pnewNode->Add(parse[0].pNode);

                parse[0].pNode    = pnewNode;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;
                break;
            }

                // B --> B '?'
            case RE_BQuestion: {
                const auto pnewNode = new RegExprDFANode{RegExprDFANode::NodeType::Question};
                pnewNode->Add(parse[0].pNode);

                parse[0].pNode    = pnewNode;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;
                break;
            }

                // B --> C
            case RE_B:
                break;

                // C --> '(' RegExp ')'
            case RE_CParen:
                parse[0].pNode    = parse[1].pNode;
                parse[0].DataType = parse[1].DataType;
                break;

                // C --> character
            case RE_CChar:
                parse[0].pNode    = new RegExprDFANode{RegExprDFANode::NodeType::Char,
                                                       PositionCount++, parse[0].ch};
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;

                Nodes.push_back(parse[0].pNode);
                break;

                // C --> '.'
            case RE_CDot: {
                // Construct a list of all characters but '\n'
                std::vector<unsigned> charList;
                charList.reserve(253u);
                for (unsigned k = 1u; k <= 255u; ++k)
                    if (k != '\n' && k != '\r')
                        charList.push_back(k);

                parse[0].pNode    = new RegExprDFANode{RegExprDFANode::NodeType::Char,
                                                       PositionCount++, charList};
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;

                Nodes.push_back(parse[0].pNode);
                break;
            }

                // C --> '[' GroupSet ']'
            case RE_CGroupSet: {
                const auto pgroupSet = parse[1].pChars;
                std::vector<unsigned> charList;

                // Construct a list of all the characters represented by the groupSet...
                for (size_t i = 0u; i < pgroupSet->size(); i += 2u)
                    for (unsigned j = (*pgroupSet)[i]; j <= (*pgroupSet)[i + 1u]; ++j)
                        charList.push_back(j);

                // Delete std::vector
                parse[1].Destroy();

                parse[0].pNode    = new RegExprDFANode{RegExprDFANode::NodeType::Char,
                                                       PositionCount++, charList};
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;

                Nodes.push_back(parse[0].pNode);
                break;
            }

                // C --> '[' '^' GroupSet ']'
            case RE_CNotGroupSet: {
                // Make a NFA out of the sequence
                const auto pgroupSet = parse[2].pChars;
                std::vector<unsigned> charList;

                // Construct a list of all the characters NOT represented by the groupSet...
                // NOTE: Depends on 0..255 ASCII
                for (unsigned k = 1u; k <= 255u; ++k) {
                    bool f = false;
                    for (size_t i = 0u; i < pgroupSet->size(); i += 2u)
                        for (unsigned j = (*pgroupSet)[i]; j <= (*pgroupSet)[i + 1u]; ++j)
                            if (j == k)
                                f = true;

                    if (!f)
                        charList.push_back(k);
                }
                // Delete std::vector
                parse[2].Destroy();

                parse[0].pNode    = new RegExprDFANode{RegExprDFANode::NodeType::Char,
                                                       PositionCount++, charList};
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;

                Nodes.push_back(parse[0].pNode);
                break;
            }

                // C --> '{' CharSet '}'
            case RE_CCharSet: {
                // Generate a string from the char std::vector
                SG_ASSERT(parse[1].pChars);
                String macroName;
                macroName.reserve(parse[1].pChars->size());
                for (auto const& ord : *parse[1].pChars) {
                    macroName.push_back(char(ord));
                }

                // Delete the character std::vector
                parse[1].Destroy();

                // Try to find it in macro list
                SG_ASSERT(pMacroSyntaxTrees != nullptr);
                auto const& map = *pMacroSyntaxTrees;
                auto const& iter = map.find(macroName);
                if (iter == map.end()) {
                    std::string names;
                    for (auto const& [name, _] : map)
                        names += " '" + name + '\'';
                    pLex->CheckForErrorAndReport("Macro '%s' not defined; there are %zu known macros:%s",
                                                 macroName.data(), map.size(), names.data());
                    // Bad!
                    return false;
                }

                // Invariant: macroName should also be in pLex->Macros:
                SG_ASSERT(pLex != nullptr);
                SG_ASSERT(pLex->Macros.find(macroName) != pLex->Macros.end());

                // Get the macro node from the Macros list
                SG_ASSERT(iter->second);
                auto& macroTree = *iter->second;

                if (!macroTree.pRoot) {
                    pLex->CheckForErrorAndReport("Invalid regular expression in macro '%s' used",
                                                 macroName.data());
                    // Bad!
                    return false;
                }

                // Change all the character positions
                parse[0].pNode    = macroTree.pRoot;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;

                // Take care of nodes
                Nodes.insert(Nodes.end(), macroTree.CharNodes.begin(), macroTree.CharNodes.end());

                // clear the temporary tree
                macroTree.pRoot = nullptr;
                break;
            }

            // GroupSet --> character
            case RE_GroupSetChar: {
                // Start off a new std::vector of char pairs
                const auto code   = parse[0].ch;

                parse[0].pChars   = new std::vector<unsigned>;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Chars;
                parse[0].pChars->push_back(code);
                parse[0].pChars->push_back(code);
                break;
            }

                // GroupSet --> character GroupSet
            case RE_GroupSetCharGroupSet:
                // Add the char to the end of the CharSet std::vector
                parse[1].pChars->push_back(parse[0].ch);
                parse[0].pChars   = parse[1].pChars;
                parse[0].DataType = parse[1].DataType;
                break;

                // GroupSet --> character '-' character
            case RE_GroupSetCharList: {
                // Start off a new std::vector of char pairs
                const auto code   = parse[0].ch;
                const auto code2  = parse[2].ch;

                parse[0].pChars   = new std::vector<unsigned>;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Chars;
                parse[0].pChars->push_back(code);
                parse[0].pChars->push_back(code2);
                break;
            }

                // GroupSet --> character '-' character GroupSet
            case RE_GroupSetCharListGroupSet: {
                // Add the char to the end of the CharSet std::vector
                const auto code   = parse[0].ch;
                const auto code2  = parse[2].ch;

                parse[3].pChars->push_back(code);
                parse[3].pChars->push_back(code2);
                parse[0].pChars   = parse[3].pChars;
                parse[0].DataType = parse[3].DataType;
                break;
            }

                // CharSet --> character
            case RE_CharSet: {
                // Get the code and add it to the new std::vector
                const auto code   = parse[0].ch;
                // Create a new std::vector of chars
                parse[0].pChars   = new std::vector<unsigned>;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Chars;
                parse[0].pChars->push_back(code);
                break;
            }

                // CharSet --> CharSet character
            case RE_CharSetChar:
                // Add the char to the end of the CharSet std::vector
                parse[0].pChars->push_back(parse[1].ch);
                break;

            default:
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Null;
                break;
        }

        return true;
    }